

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darScript.c
# Opt level: O2

int Dar_NewChoiceSynthesisGuard(Aig_Man_t *pAig)

{
  uint uVar1;
  void *pvVar2;
  int i;
  int iVar3;
  
  iVar3 = 0;
  for (i = 0; i < pAig->vObjs->nSize; i = i + 1) {
    pvVar2 = Vec_PtrEntry(pAig->vObjs,i);
    if (((pvVar2 != (void *)0x0) && (uVar1 = *(uint *)((long)pvVar2 + 0x18), 0xfa3f < uVar1)) &&
       ((uVar1 & 7) - 5 < 2)) {
      iVar3 = iVar3 + uVar1 / 64000;
    }
  }
  return (int)(10 < iVar3);
}

Assistant:

int Dar_NewChoiceSynthesisGuard( Aig_Man_t * pAig )
{
    Aig_Obj_t * pObj;
    int i, Count = 0;
    Aig_ManForEachNode( pAig, pObj, i )
        if ( Aig_ObjRefs(pObj) > 1000 )
            Count += Aig_ObjRefs(pObj) / 1000;
    return (int)(Count > 10);
}